

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O3

bool __thiscall
basisu::tree_vector_quant<basisu::vec<6U,_float>_>::generate
          (tree_vector_quant<basisu::vec<6U,_float>_> *this,uint32_t max_size)

{
  uint32_t uVar1;
  uint node_index;
  tsvq_node *ptVar2;
  bool bVar3;
  char *__function;
  uint uVar4;
  vector<unsigned_int> r_children;
  vector<unsigned_int> l_children;
  priority_queue var_heap;
  vector<unsigned_int> local_98;
  vector<unsigned_int> local_88;
  undefined1 local_78 [8];
  uint64_t uStack_70;
  float local_68;
  uint *local_48;
  
  uVar1 = (this->m_training_vecs).m_size;
  if (uVar1 != 0) {
    this->m_next_codebook_index = 0;
    ptVar2 = (this->m_nodes).m_p;
    vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node>::erase
              (&this->m_nodes,ptVar2,ptVar2 + (this->m_nodes).m_size);
    vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node>::reserve
              (&this->m_nodes,(ulong)(max_size * 2 + 1));
    prepare_root((tsvq_node *)local_78,this);
    vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node>::push_back
              (&this->m_nodes,(tsvq_node *)local_78);
    if (local_48 != (uint *)0x0) {
      free(local_48);
    }
    local_78 = (undefined1  [8])0x0;
    uStack_70 = 0;
    local_68 = 0.0;
    if ((this->m_nodes).m_size == 0) {
LAB_0023a638:
      __function = 
      "T &basisu::vector<basisu::tree_vector_quant<basisu::vec<6, float>>::tsvq_node>::operator[](size_t) [T = basisu::tree_vector_quant<basisu::vec<6, float>>::tsvq_node]"
      ;
LAB_0023a664:
      __assert_fail("i < m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                    ,0x178,__function);
    }
    priority_queue::init((priority_queue *)local_78,(EVP_PKEY_CTX *)(ulong)max_size);
    local_88.m_p = (uint *)0x0;
    local_88.m_size = 0;
    local_88.m_capacity = 0;
    local_98.m_p = (uint *)0x0;
    local_98.m_size = 0;
    local_98.m_capacity = 0;
    vector<unsigned_int>::reserve(&local_88,(ulong)((this->m_training_vecs).m_size + 1));
    vector<unsigned_int>::reserve(&local_98,(ulong)((this->m_training_vecs).m_size + 1));
    if (1 < max_size && local_68 != 0.0) {
      uVar4 = 1;
      do {
        if ((uint)(float)uStack_70 < 2) {
          __assert_fail("i < m_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                        ,0x177,
                        "const T &basisu::vector<basisu::priority_queue::entry>::operator[](size_t) const [T = basisu::priority_queue::entry]"
                       );
        }
        node_index = ((entry *)((long)local_78 + 8))->m_index;
        if ((this->m_nodes).m_size <= node_index) goto LAB_0023a638;
        ptVar2 = (this->m_nodes).m_p;
        if ((ptVar2[node_index].m_var != ((entry *)((long)local_78 + 8))->m_priority) ||
           (NAN(ptVar2[node_index].m_var) || NAN(((entry *)((long)local_78 + 8))->m_priority))) {
          __assert_fail("node.m_var == var_heap.get_top_priority()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                        ,0x5de,
                        "bool basisu::tree_vector_quant<basisu::vec<6, float>>::generate(uint32_t) [TrainingVectorType = basisu::vec<6, float>]"
                       );
        }
        if (-1 < ptVar2[node_index].m_left_index) {
          __assert_fail("node.is_leaf()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                        ,0x5df,
                        "bool basisu::tree_vector_quant<basisu::vec<6, float>>::generate(uint32_t) [TrainingVectorType = basisu::vec<6, float>]"
                       );
        }
        if ((uint)(float)uStack_70 <= (uint)local_68) {
          __function = 
          "T &basisu::vector<basisu::priority_queue::entry>::operator[](size_t) [T = basisu::priority_queue::entry]"
          ;
          goto LAB_0023a664;
        }
        *(entry *)((long)local_78 + 8) = *(entry *)((long)local_78 + (ulong)(uint)local_68 * 8);
        local_68 = (float)((int)local_68 - 1);
        if (local_68 != 0.0) {
          priority_queue::down_heap((priority_queue *)local_78,1);
        }
        if (1 < ptVar2[node_index].m_training_vecs.m_size) {
          bVar3 = split_node(this,node_index,(priority_queue *)local_78,&local_88,&local_98);
          uVar4 = uVar4 + bVar3;
        }
      } while ((local_68 != 0.0) && (uVar4 < max_size));
    }
    if (local_98.m_p != (uint *)0x0) {
      free(local_98.m_p);
    }
    if (local_88.m_p != (uint *)0x0) {
      free(local_88.m_p);
    }
    if (local_78 != (undefined1  [8])0x0) {
      free((void *)local_78);
    }
  }
  return uVar1 != 0;
}

Assistant:

inline vec &operator/= (const vec &other) { for (uint32_t i = 0; i < N; i++) m_v[i] /= other.m_v[i]; return *this; }